

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O0

int ARKodeSetCFLFraction(void *arkode_mem,sunrealtype cfl_frac)

{
  double in_XMM0_Qa;
  ARKodeMem ark_mem;
  ARKodeHAdaptMem hadapt_mem;
  int retval;
  ARKodeMem *in_stack_ffffffffffffffc8;
  ARKodeMem in_stack_ffffffffffffffd0;
  void *in_stack_ffffffffffffffd8;
  int local_4;
  
  local_4 = arkAccessHAdaptMem(in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0,
                               in_stack_ffffffffffffffc8,(ARKodeHAdaptMem *)0x1518ba);
  if (local_4 == 0) {
    if (in_stack_ffffffffffffffd0->step_supports_adaptive == 0) {
      arkProcessError(in_stack_ffffffffffffffd0,-0x30,0x5fc,"ARKodeSetCFLFraction",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                      ,"time-stepping module does not support temporal adaptivity");
      local_4 = -0x30;
    }
    else if (in_XMM0_Qa < 1.0) {
      if (0.0 < in_XMM0_Qa) {
        *(double *)((long)in_stack_ffffffffffffffd8 + 0x30) = in_XMM0_Qa;
      }
      else {
        *(undefined8 *)((long)in_stack_ffffffffffffffd8 + 0x30) = 0x3fe0000000000000;
      }
      local_4 = 0;
    }
    else {
      arkProcessError(in_stack_ffffffffffffffd0,-0x16,0x604,"ARKodeSetCFLFraction",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                      ,"Illegal CFL fraction");
      local_4 = -0x16;
    }
  }
  return local_4;
}

Assistant:

int ARKodeSetCFLFraction(void* arkode_mem, sunrealtype cfl_frac)
{
  int retval;
  ARKodeHAdaptMem hadapt_mem;
  ARKodeMem ark_mem;
  retval = arkAccessHAdaptMem(arkode_mem, __func__, &ark_mem, &hadapt_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Guard against use for non-adaptive time stepper modules */
  if (!ark_mem->step_supports_adaptive)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not support temporal adaptivity");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* check for allowable parameters */
  if (cfl_frac >= ONE)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Illegal CFL fraction");
    return (ARK_ILL_INPUT);
  }

  /* set positive-valued parameters, otherwise set default */
  if (cfl_frac <= ZERO) { hadapt_mem->cfl = CFLFAC; }
  else { hadapt_mem->cfl = cfl_frac; }

  return (ARK_SUCCESS);
}